

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int EXRLayers(char *filename,char ***layer_names,int *num_layers,char **err)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  int unaff_EBP;
  long lVar5;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_vec;
  EXRVersion exr_version;
  EXRHeader exr_header;
  undefined1 local_1f8 [44];
  EXRVersion local_1cc;
  EXRHeader local_1b8;
  
  memset(&local_1b8,0,0x188);
  iVar2 = ParseEXRVersionFromFile(&local_1cc,filename);
  if (iVar2 == 0) {
    if (local_1cc.non_image == 0 && local_1cc.multipart == 0) {
      bVar1 = true;
      goto LAB_001038bc;
    }
    local_1f8._0_8_ = (pointer)(local_1f8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,
               "Loading multipart or DeepImage is not supported  in LoadEXR() API","");
    if (err != (char **)0x0) {
      pcVar3 = strdup((char *)local_1f8._0_8_);
      *err = pcVar3;
    }
    if ((pointer)local_1f8._0_8_ != (pointer)(local_1f8 + 0x10)) {
      operator_delete((void *)local_1f8._0_8_);
    }
    iVar2 = -4;
  }
  else {
    local_1f8._0_8_ = (pointer)(local_1f8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"Invalid EXR header.","");
    if (err != (char **)0x0) {
      pcVar3 = strdup((char *)local_1f8._0_8_);
      *err = pcVar3;
    }
    if ((pointer)local_1f8._0_8_ != (pointer)(local_1f8 + 0x10)) {
      operator_delete((void *)local_1f8._0_8_);
    }
  }
  bVar1 = false;
  unaff_EBP = iVar2;
LAB_001038bc:
  if (bVar1) {
    unaff_EBP = ParseEXRHeaderFromFile(&local_1b8,&local_1cc,filename,err);
    if (unaff_EBP == 0) {
      local_1f8._0_8_ = (pointer)0x0;
      local_1f8._8_8_ = (pointer)0x0;
      local_1f8._16_8_ = (pointer)0x0;
      tinyexr::GetLayers(&local_1b8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_1f8);
      *num_layers = (int)((ulong)(local_1f8._8_8_ - local_1f8._0_8_) >> 5);
      ppcVar4 = (char **)malloc((long)(local_1f8._8_8_ - local_1f8._0_8_) >> 2);
      *layer_names = ppcVar4;
      if (local_1f8._8_8_ != local_1f8._0_8_) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          pcVar3 = strdup(*(char **)((long)&((_Alloc_hider *)local_1f8._0_8_)->_M_p + lVar5));
          (*layer_names)[uVar6] = pcVar3;
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x20;
        } while (uVar6 < (ulong)((long)(local_1f8._8_8_ - local_1f8._0_8_) >> 5));
      }
      FreeEXRHeader(&local_1b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1f8);
      unaff_EBP = 0;
    }
    else {
      FreeEXRHeader(&local_1b8);
    }
  }
  return unaff_EBP;
}

Assistant:

int EXRLayers(const char *filename, const char **layer_names[], int *num_layers,
              const char **err) {
  EXRVersion exr_version;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      tinyexr::SetErrorMessage("Invalid EXR header.", err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
          "Loading multipart or DeepImage is not supported  in LoadEXR() API",
          err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
  if (ret != TINYEXR_SUCCESS) {
    FreeEXRHeader(&exr_header);
    return ret;
  }

  std::vector<std::string> layer_vec;
  tinyexr::GetLayers(exr_header, layer_vec);

  (*num_layers) = int(layer_vec.size());
  (*layer_names) = static_cast<const char **>(
      malloc(sizeof(const char *) * static_cast<size_t>(layer_vec.size())));
  for (size_t c = 0; c < static_cast<size_t>(layer_vec.size()); c++) {
#ifdef _MSC_VER
    (*layer_names)[c] = _strdup(layer_vec[c].c_str());
#else
    (*layer_names)[c] = strdup(layer_vec[c].c_str());
#endif
  }

  FreeEXRHeader(&exr_header);
  return TINYEXR_SUCCESS;
}